

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QTabBar_*,_QHashDummyValue>::emplace_helper<QHashDummyValue>
          (QHash<QTabBar_*,_QHashDummyValue> *this,QTabBar **key,QHashDummyValue *args)

{
  piter pVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QTabBar*,QHashDummyValue>>::findOrInsert<QTabBar*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<QTabBar*,QHashDummyValue>> *)this->d,key);
  if (local_38[0x10] == false) {
    *(QTabBar **)
     (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries
     [(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]].storage.data = *key;
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }